

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoisePrintKeyCodes(void)

{
  int iVar1;
  ssize_t sVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  char c;
  char quit [4];
  char local_2d;
  int local_2c;
  
  puts(
      "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit."
      );
  iVar1 = enableRawMode(0);
  if (iVar1 != -1) {
    local_2c = 0x20202020;
    while( true ) {
      do {
        local_2d = '\0';
        sVar2 = read(0,&local_2d,1);
      } while ((int)sVar2 < 1);
      uVar4 = (uint)local_2d;
      local_2c = CONCAT13(local_2d,(int3)((uint)local_2c >> 8));
      if (local_2c == 0x74697571) break;
      ppuVar3 = __ctype_b_loc();
      uVar5 = 0x3f;
      if (((*ppuVar3)[(int)uVar4] >> 0xe & 1) != 0) {
        uVar5 = (ulong)uVar4;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",uVar5,(ulong)uVar4,(ulong)uVar4);
      putchar(0xd);
      fflush(_stdout);
    }
    if (rawmode == '\x01') {
      iVar1 = tcsetattr(0,2,(termios *)&orig_termios);
      if (iVar1 != -1) {
        rawmode = '\0';
      }
    }
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
    char quit[4];

    printf("Linenoise key codes debugging mode.\n"
            "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
    if (enableRawMode(STDIN_FILENO) == -1) return;
    memset(quit,' ',4);
    while(1) {
        char c = 0;
        int nread;

        nread = read(STDIN_FILENO,&c,sizeof c);
        if (nread <= 0) continue;
        memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
        quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
        if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

        printf("'%c' %02x (%d) (type quit to exit)\n",
            isprint((int)c) ? c : '?', (int)c, (int)c);
        printf("\r"); /* Go left edge manually, we are in raw mode. */
        fflush(stdout);
    }
    disableRawMode(STDIN_FILENO);
}